

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVector<llbuild::buildsystem::BuildKey,_1U>::~SmallVector
          (SmallVector<llbuild::buildsystem::BuildKey,_1U> *this)

{
  undefined1 *__ptr;
  ulong uVar1;
  long lVar2;
  
  __ptr = (undefined1 *)
          (this->super_SmallVectorImpl<llbuild::buildsystem::BuildKey>).
          super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
          super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
          super_SmallVectorBase.BeginX;
  uVar1 = (ulong)(this->super_SmallVectorImpl<llbuild::buildsystem::BuildKey>).
                 super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
                 super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
                 super_SmallVectorBase.Size;
  if (uVar1 != 0) {
    lVar2 = uVar1 << 5;
    do {
      if ((long *)(__ptr + lVar2 + -0x10) != *(long **)(__ptr + lVar2 + -0x20)) {
        operator_delete(*(long **)(__ptr + lVar2 + -0x20),*(long *)(__ptr + lVar2 + -0x10) + 1);
      }
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != 0);
    __ptr = (undefined1 *)
            (this->super_SmallVectorImpl<llbuild::buildsystem::BuildKey>).
            super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
            super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
            super_SmallVectorBase.BeginX;
  }
  if ((SmallVectorStorage<llbuild::buildsystem::BuildKey,_1U> *)__ptr !=
      &this->super_SmallVectorStorage<llbuild::buildsystem::BuildKey,_1U>) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

~SmallVector() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());
  }